

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddDeferredStubs
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,
          DeferredFunctionStub *deferredStubs,uint stubsCount,ByteCodeCache *cache,bool recursive)

{
  DeferredFunctionStub *value;
  BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *dictionary;
  Ident *pIVar1;
  code *pcVar2;
  bool bVar3;
  int value_00;
  undefined4 *puVar4;
  Recycler *this_00;
  int *ptr;
  EntryType *pEVar5;
  ulong uVar6;
  uint value_01;
  uint uVar7;
  undefined1 local_b8 [8];
  EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  TrackAllocData data;
  
  if (stubsCount == 0 || deferredStubs != (DeferredFunctionStub *)0x0) {
    if (stubsCount != 0 && deferredStubs != (DeferredFunctionStub *)0x0) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (uVar6 = 0; uVar6 != stubsCount; uVar6 = uVar6 + 1) {
        value = deferredStubs + uVar6;
        PrependInt32(this,builder,L"Character Min",deferredStubs[uVar6].ichMin,
                     (BufferBuilderInt32 **)0x0);
        PrependInt32(this,builder,L"Function flags",deferredStubs[uVar6].fncFlags,
                     (BufferBuilderInt32 **)0x0);
        PrependStruct<RestorePoint>(this,builder,L"Restore Point",&value->restorePoint);
        dictionary = deferredStubs[uVar6].capturedNamePointers.ptr;
        if ((dictionary ==
             (BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)0x0) ||
           (value_01 = (dictionary->
                       super_BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ).count - (dictionary->
                                 super_BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 ).freeCount, value_01 == 0)) {
          PrependInt32(this,builder,L"Captured Name Count",0,(BufferBuilderInt32 **)0x0);
        }
        else {
          JsUtil::
          BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                           *)local_b8,dictionary);
          PrependInt32(this,builder,L"Captured Name Count",value_01,(BufferBuilderInt32 **)0x0);
          if (cache != (ByteCodeCache *)0x0) {
            value->capturedNameCount = value_01;
            iter.
            super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
            ._24_8_ = &int::typeinfo;
            this_00 = Memory::Recycler::TrackAllocInfo
                                (this->scriptContext->recycler,
                                 (TrackAllocData *)
                                 &iter.
                                  super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                  .usedEntryCount);
            ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                            ((Memory *)this_00,(Recycler *)Memory::Recycler::Alloc,0,(ulong)value_01
                            );
            Memory::WriteBarrierPtr<int>::WriteBarrierSet(&value->capturedNameSerializedIds,ptr);
            Memory::WriteBarrierPtr<Js::ByteCodeCache>::WriteBarrierSet(&value->byteCodeCache,cache)
            ;
          }
          uVar7 = 0;
          while( true ) {
            bVar3 = JsUtil::
                    BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::
                    EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                    ::IsValid((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                               *)local_b8);
            if (!bVar3) break;
            pEVar5 = JsUtil::
                     BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ::
                     IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                     ::Current((IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                *)local_b8);
            pIVar1 = (pEVar5->
                     super_DefaultHashedEntry<Ident_*,_Ident_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                     ).super_ImplicitKeyValueEntry<Ident_*,_Ident_*>.
                     super_ValueEntry<Ident_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Ident_*>_>
                     .super_ValueEntryData<Ident_*>.value;
            value_00 = GetIdOfString(this,(LPCWSTR)&pIVar1->field_0x22,pIVar1->m_cch * 2 + 2);
            if (cache != (ByteCodeCache *)0x0) {
              if (value_01 <= uVar7) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar4 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                            ,0xa37,"(j < capturedNamesCount)",
                                            "j < capturedNamesCount");
                if (!bVar3) goto LAB_007b34e7;
                *puVar4 = 0;
              }
              (value->capturedNameSerializedIds).ptr[uVar7] = value_00;
            }
            PrependInt32(this,builder,L"Captured Name",value_00,(BufferBuilderInt32 **)0x0);
            JsUtil::
            BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::MoveNext((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                        *)local_b8);
            uVar7 = uVar7 + 1;
          }
        }
        PrependInt32(this,builder,L"Nested Count",value->nestedCount,(BufferBuilderInt32 **)0x0);
        if (recursive) {
          AddDeferredStubs(this,builder,(value->deferredStubs).ptr,value->nestedCount,cache,true);
        }
      }
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xa0c,"(!(deferredStubs == nullptr && stubsCount > 0))",
                                "!(deferredStubs == nullptr && stubsCount > 0)");
    if (!bVar3) {
LAB_007b34e7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return 0;
}

Assistant:

HRESULT AddDeferredStubs(BufferBuilderList & builder, DeferredFunctionStub* deferredStubs, uint stubsCount, ByteCodeCache* cache, bool recursive)
    {
        AssertOrFailFast(!(deferredStubs == nullptr && stubsCount > 0));

        if (deferredStubs == nullptr || stubsCount == 0)
        {
            return S_OK;
        }

        for (uint i = 0; i < stubsCount; i++)
        {
            DeferredFunctionStub* currentStub = deferredStubs + i;

            PrependUInt32(builder, _u("Character Min"), currentStub->ichMin);
            PrependUInt32(builder, _u("Function flags"), currentStub->fncFlags);
            PrependStruct(builder, _u("Restore Point"), &(currentStub->restorePoint));

            // Add all the captured name ids
            IdentPtrSet *capturedNames = currentStub->capturedNamePointers;

            if (capturedNames != nullptr && capturedNames->Count() != 0)
            {
                uint capturedNamesCount = capturedNames->Count();
                auto iter = capturedNames->GetIterator();

                PrependUInt32(builder, _u("Captured Name Count"), capturedNamesCount);

                if (cache != nullptr)
                {
                    currentStub->capturedNameCount = capturedNamesCount;
                    currentStub->capturedNameSerializedIds = RecyclerNewArray(this->scriptContext->GetRecycler(), int, capturedNamesCount);
                    currentStub->byteCodeCache = cache;
                }

                uint j = 0;
                while (iter.IsValid())
                {
                    // The captured names are IdentPtr allocated in Parser arena memory.
                    // We have to convert them to indices into our string table to effectively
                    // serialize the names.
                    const IdentPtr& pid = iter.CurrentValueReference();
                    int capturedNameSerializedId = this->GetIdOfString(pid->Psz(), (pid->Cch() + 1) * sizeof(WCHAR));

                    if (cache != nullptr)
                    {
                        Assert(j < capturedNamesCount);
                        currentStub->capturedNameSerializedIds[j] = capturedNameSerializedId;
                    }

                    PrependInt32(builder, _u("Captured Name"), capturedNameSerializedId);

                    iter.MoveNext();
                    j++;
                }
            }
            else
            {
                PrependUInt32(builder, _u("Captured Name Count"), 0);
            }

            PrependUInt32(builder, _u("Nested Count"), currentStub->nestedCount);
            if (recursive)
            {
                AddDeferredStubs(builder, currentStub->deferredStubs, currentStub->nestedCount, cache, recursive);
            }
        }

        return S_OK;
    }